

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralNormalFilteringForMeshDenoising.cpp
# Opt level: O0

void __thiscall
BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme
          (BilateralNormalFilteringForMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *ppVVar1;
  pointer *this_00;
  ParameterSet *pPVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  BaseHandle *pBVar6;
  reference pvVar7;
  reference __x;
  reference pvVar8;
  FaceIter FVar9;
  vector_type local_2a8;
  double local_290;
  double weight;
  double range_weight;
  double local_268;
  double range_distance;
  double spatial_weight;
  double local_240;
  double spatial_distance;
  Point cj;
  undefined1 auStack_218 [8];
  Normal nj;
  int index_j;
  int i;
  double weight_sum;
  Normal temp_normal;
  undefined1 local_1d0 [4];
  int size;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  Point ci;
  undefined1 auStack_198 [8];
  Normal ni;
  undefined1 auStack_178 [4];
  int index_i;
  value_handle local_170;
  uint uStack_16c;
  undefined1 local_168 [8];
  FaceIter f_it;
  int iter;
  double sigma_c;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<double,_std::allocator<double>_> face_area;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  FaceNeighborType face_neighbor_type;
  double local_c0;
  double sigma_s;
  string local_b0 [32];
  int local_90;
  allocator local_89;
  int normal_iteration_number;
  double local_68;
  double multiple_sigma_c;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *pvStack_20;
  int face_neighbor_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *filtered_normals_local;
  TriMesh *mesh_local;
  BilateralNormalFilteringForMeshDenoising *this_local;
  
  pvStack_20 = filtered_normals;
  filtered_normals_local =
       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)mesh;
  mesh_local = (TriMesh *)this;
  sVar5 = (**(code **)(*(long *)&(mesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))();
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            (filtered_normals,sVar5);
  pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Face Neighbor",&local_49);
  bVar4 = ParameterSet::getValue(pPVar2,(string *)local_48,&local_24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&normal_iteration_number,"Multiple(* sigma_c)",&local_89)
    ;
    bVar4 = ParameterSet::getValue(pPVar2,(string *)&normal_iteration_number,&local_68);
    std::__cxx11::string::~string((string *)&normal_iteration_number);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,"Normal Iteration Num.",(allocator *)((long)&sigma_s + 7));
      bVar4 = ParameterSet::getValue(pPVar2,(string *)local_b0,&local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&sigma_s + 7));
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&face_neighbor_type,"sigma_s",
                   (allocator *)
                   ((long)&all_face_neighbor.
                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        bVar4 = ParameterSet::getValue(pPVar2,(string *)&face_neighbor_type,&local_c0);
        std::__cxx11::string::~string((string *)&face_neighbor_type);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&all_face_neighbor.
                           super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          all_face_neighbor.
          super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (FaceNeighborType)(local_24 != 0);
          ppVVar1 = &previous_normals.
                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    *)ppVVar1);
          MeshDenoisingBase::getAllFaceNeighbor
                    (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                     (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                      *)ppVVar1,
                     (FaceNeighborType)
                     all_face_neighbor.
                     super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          this_00 = &face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)this_00);
          MeshDenoisingBase::getFaceNormal
                    (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)this_00);
          ppVVar1 = &face_centroid.
                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::vector<double,_std::allocator<double>_>::vector
                    ((vector<double,_std::allocator<double>_> *)ppVVar1);
          MeshDenoisingBase::getFaceArea
                    (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                     (vector<double,_std::allocator<double>_> *)ppVVar1);
          std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)&sigma_c);
          MeshDenoisingBase::getFaceCentroid
                    (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)&sigma_c);
          dVar3 = getSigmaC(this,(TriMesh *)filtered_normals_local,
                            (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                             *)&sigma_c,local_68);
          for (f_it.skip_bits_ = 0; (int)f_it.skip_bits_ < local_90;
              f_it.skip_bits_ = f_it.skip_bits_ + 1) {
            FVar9 = OpenMesh::PolyConnectivity::faces_begin
                              ((PolyConnectivity *)filtered_normals_local);
            while( true ) {
              f_it.mesh_ = FVar9._8_8_;
              local_168 = (undefined1  [8])FVar9.mesh_;
              FVar9 = OpenMesh::PolyConnectivity::faces_end
                                ((PolyConnectivity *)filtered_normals_local);
              _auStack_178 = FVar9;
              bVar4 = OpenMesh::Iterators::
                      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                      ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)local_168,
                                   (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)auStack_178);
              if (!bVar4) break;
              pBVar6 = &OpenMesh::Iterators::
                        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                        ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                      *)local_168)->super_BaseHandle;
              ni.super_VectorDataT<double,_3>.values_[2]._4_4_ = OpenMesh::BaseHandle::idx(pBVar6);
              pvVar7 = std::
                       vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     *)&face_area.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage,
                                    (long)ni.super_VectorDataT<double,_3>.values_[2]._4_4_);
              ni.super_VectorDataT<double,_3>.values_[1] =
                   (pvVar7->super_VectorDataT<double,_3>).values_[2];
              auStack_198 = (undefined1  [8])(pvVar7->super_VectorDataT<double,_3>).values_[0];
              ni.super_VectorDataT<double,_3>.values_[0] =
                   (pvVar7->super_VectorDataT<double,_3>).values_[1];
              pvVar7 = std::
                       vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     *)&sigma_c,
                                    (long)ni.super_VectorDataT<double,_3>.values_[2]._4_4_);
              face_neighbor.
              super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(pvVar7->super_VectorDataT<double,_3>).values_[0];
              __x = std::
                    vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    ::operator[]((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                  *)&previous_normals.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (long)ni.super_VectorDataT<double,_3>.values_[2]._4_4_);
              std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_1d0,__x);
              sVar5 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::size
                                ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  *)local_1d0);
              temp_normal.super_VectorDataT<double,_3>.values_[2]._4_4_ = (int)sVar5;
              OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)&weight_sum,0.0,0.0,0.0);
              _index_j = 0.0;
              for (nj.super_VectorDataT<double,_3>.values_[2]._4_4_ = 0;
                  nj.super_VectorDataT<double,_3>.values_[2]._4_4_ <
                  temp_normal.super_VectorDataT<double,_3>.values_[2]._4_4_;
                  nj.super_VectorDataT<double,_3>.values_[2]._4_4_ =
                       nj.super_VectorDataT<double,_3>.values_[2]._4_4_ + 1) {
                pBVar6 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                          operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                      *)local_1d0,
                                     (long)nj.super_VectorDataT<double,_3>.values_[2]._4_4_)->
                          super_BaseHandle;
                nj.super_VectorDataT<double,_3>.values_[2]._0_4_ = OpenMesh::BaseHandle::idx(pBVar6)
                ;
                pvVar7 = std::
                         vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)&face_area.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                                      (long)nj.super_VectorDataT<double,_3>.values_[2]._0_4_);
                nj.super_VectorDataT<double,_3>.values_[1] =
                     (pvVar7->super_VectorDataT<double,_3>).values_[2];
                auStack_218 = (undefined1  [8])(pvVar7->super_VectorDataT<double,_3>).values_[0];
                nj.super_VectorDataT<double,_3>.values_[0] =
                     (pvVar7->super_VectorDataT<double,_3>).values_[1];
                pvVar7 = std::
                         vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       *)&sigma_c,
                                      (long)nj.super_VectorDataT<double,_3>.values_[2]._0_4_);
                cj.super_VectorDataT<double,_3>.values_[1] =
                     (pvVar7->super_VectorDataT<double,_3>).values_[2];
                spatial_distance = (pvVar7->super_VectorDataT<double,_3>).values_[0];
                cj.super_VectorDataT<double,_3>.values_[0] =
                     (pvVar7->super_VectorDataT<double,_3>).values_[1];
                OpenMesh::VectorT<double,_3>::operator-
                          ((vector_type *)&spatial_weight,
                           (VectorT<double,_3> *)
                           &face_neighbor.
                            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector_type *)&spatial_distance);
                local_240 = OpenMesh::VectorT<double,_3>::length
                                      ((VectorT<double,_3> *)&spatial_weight);
                range_distance = exp((local_240 * -0.5 * local_240) / (dVar3 * dVar3));
                OpenMesh::VectorT<double,_3>::operator-
                          ((vector_type *)&range_weight,(VectorT<double,_3> *)auStack_198,
                           (vector_type *)auStack_218);
                local_268 = OpenMesh::VectorT<double,_3>::length
                                      ((VectorT<double,_3> *)&range_weight);
                weight = exp((local_268 * -0.5 * local_268) / (local_c0 * local_c0));
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)
                                    &face_centroid.
                                     super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (long)nj.super_VectorDataT<double,_3>.values_[2]._0_4_);
                local_290 = *pvVar8 * range_distance * weight;
                _index_j = _index_j + local_290;
                OpenMesh::VectorT<double,_3>::operator*
                          (&local_2a8,(VectorT<double,_3> *)auStack_218,&local_290);
                OpenMesh::VectorT<double,_3>::operator+=
                          ((VectorT<double,_3> *)&weight_sum,&local_2a8);
              }
              OpenMesh::VectorT<double,_3>::operator/=
                        ((VectorT<double,_3> *)&weight_sum,(double *)&index_j);
              OpenMesh::VectorT<double,_3>::normalize((VectorT<double,_3> *)&weight_sum);
              pvVar7 = std::
                       vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       ::operator[](pvStack_20,
                                    (long)ni.super_VectorDataT<double,_3>.values_[2]._4_4_);
              (pvVar7->super_VectorDataT<double,_3>).values_[0] = weight_sum;
              (pvVar7->super_VectorDataT<double,_3>).values_[1] =
                   temp_normal.super_VectorDataT<double,_3>.values_[0];
              (pvVar7->super_VectorDataT<double,_3>).values_[2] =
                   temp_normal.super_VectorDataT<double,_3>.values_[1];
              std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
                        ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                         local_1d0);
              OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
              ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_168,0);
              FVar9._8_8_ = f_it.mesh_;
              FVar9.mesh_ = (mesh_ptr)local_168;
            }
            std::
            vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
            operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,pvStack_20);
          }
          std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     *)&sigma_c);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)
                     &face_centroid.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     *)&face_area.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
          ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                     *)&previous_normals.
                        super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
  }
  return;
}

Assistant:

void BilateralNormalFilteringForMeshDenoising::updateFilteredNormalsLocalScheme(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    filtered_normals.resize(mesh.n_faces());

    // get parameter for local scheme normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double multiple_sigma_c;
    if(!parameter_set_->getValue(string("Multiple(* sigma_c)"), multiple_sigma_c))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;
    double sigma_s;
    if(!parameter_set_->getValue(string("sigma_s"), sigma_s))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, false);
    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_c = getSigmaC(mesh, face_centroid, multiple_sigma_c);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            int index_i = f_it->idx();
            TriMesh::Normal ni = previous_normals[index_i];
            TriMesh::Point ci = face_centroid[index_i];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[index_i];
            int size = (int)face_neighbor.size();
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            double weight_sum = 0.0;
            for(int i = 0; i < size; i++)
            {
                int index_j = face_neighbor[i].idx();
                TriMesh::Normal nj = previous_normals[index_j];
                TriMesh::Point cj = face_centroid[index_j];

                double spatial_distance = (ci - cj).length();
                double spatial_weight = std::exp( -0.5 * spatial_distance * spatial_distance / (sigma_c * sigma_c) );
                double range_distance = (ni - nj).length();
                double range_weight = std::exp( -0.5 * range_distance * range_distance / (sigma_s * sigma_s) );

                double weight = face_area[index_j] * spatial_weight * range_weight;
                weight_sum += weight;
                temp_normal += nj * weight;
            }
            temp_normal /= weight_sum;
            temp_normal.normalize();
            filtered_normals[index_i] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}